

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::javanano::FileGenerator::Generate(FileGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  long lVar3;
  int i;
  long lVar4;
  EnumGenerator EStack_68;
  
  io::Printer::Print(printer,"// Generated by the protocol buffer compiler.  DO NOT EDIT!\n");
  if ((this->java_package_)._M_string_length != 0) {
    io::Printer::Print(printer,"\npackage $package$;\n","package",&this->java_package_);
  }
  io::Printer::Print(printer,"\n@SuppressWarnings(\"hiding\")\npublic interface $classname$ {\n",
                     "classname",&this->classname_);
  io::Printer::Indent(printer);
  lVar3 = 0;
  for (lVar4 = 0; pFVar2 = this->file_, lVar4 < *(int *)(pFVar2 + 0x88); lVar4 = lVar4 + 1) {
    ExtensionGenerator::ExtensionGenerator
              ((ExtensionGenerator *)&EStack_68,
               (FieldDescriptor *)(*(long *)(pFVar2 + 0x98) + lVar3),this->params_);
    ExtensionGenerator::Generate((ExtensionGenerator *)&EStack_68,printer);
    ExtensionGenerator::~ExtensionGenerator((ExtensionGenerator *)&EStack_68);
    lVar3 = lVar3 + 0xa8;
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(pFVar2 + 0x68); lVar4 = lVar4 + 1) {
    EnumGenerator::EnumGenerator
              (&EStack_68,(EnumDescriptor *)(*(long *)(pFVar2 + 0x70) + lVar3),this->params_);
    EnumGenerator::Generate(&EStack_68,printer);
    EnumGenerator::~EnumGenerator(&EStack_68);
    pFVar2 = this->file_;
    lVar3 = lVar3 + 0x38;
  }
  bVar1 = Params::java_multiple_files(this->params_,*(string **)pFVar2);
  if (!bVar1) {
    lVar3 = 0;
    for (lVar4 = 0; lVar4 < *(int *)(this->file_ + 0x58); lVar4 = lVar4 + 1) {
      MessageGenerator::MessageGenerator
                ((MessageGenerator *)&EStack_68,
                 (Descriptor *)(*(long *)(this->file_ + 0x60) + lVar3),this->params_);
      MessageGenerator::Generate((MessageGenerator *)&EStack_68,printer);
      MessageGenerator::~MessageGenerator((MessageGenerator *)&EStack_68);
      lVar3 = lVar3 + 0xa8;
    }
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(this->file_ + 0x58); lVar4 = lVar4 + 1) {
    MessageGenerator::MessageGenerator
              ((MessageGenerator *)&EStack_68,(Descriptor *)(*(long *)(this->file_ + 0x60) + lVar3),
               this->params_);
    MessageGenerator::GenerateStaticVariables((MessageGenerator *)&EStack_68,printer);
    MessageGenerator::~MessageGenerator((MessageGenerator *)&EStack_68);
    lVar3 = lVar3 + 0xa8;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void FileGenerator::Generate(io::Printer* printer) {
  // We don't import anything because we refer to all classes by their
  // fully-qualified names in the generated source.
  printer->Print(
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n");
  if (!java_package_.empty()) {
    printer->Print(
      "\n"
      "package $package$;\n",
      "package", java_package_);
  }

  // Note: constants (from enums, emitted in the loop below) may have the same names as constants
  // in the nested classes. This causes Java warnings, but is not fatal, so we suppress those
  // warnings here in the top-most class declaration.
  printer->Print(
    "\n"
    "@SuppressWarnings(\"hiding\")\n"
    "public interface $classname$ {\n",
    "classname", classname_);
  printer->Indent();

  // -----------------------------------------------------------------

  // Extensions.
  for (int i = 0; i < file_->extension_count(); i++) {
    ExtensionGenerator(file_->extension(i), params_).Generate(printer);
  }

  // Enums.
  for (int i = 0; i < file_->enum_type_count(); i++) {
    EnumGenerator(file_->enum_type(i), params_).Generate(printer);
  }

  // Messages.
  if (!params_.java_multiple_files(file_->name())) {
    for (int i = 0; i < file_->message_type_count(); i++) {
      MessageGenerator(file_->message_type(i), params_).Generate(printer);
    }
  }

  // Static variables.
  for (int i = 0; i < file_->message_type_count(); i++) {
    // TODO(kenton):  Reuse MessageGenerator objects?
    MessageGenerator(file_->message_type(i), params_).GenerateStaticVariables(printer);
  }

  printer->Outdent();
  printer->Print(
    "}\n");
}